

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RasterizerTests::CoordinatesAreTranslatedAfterClipping(RasterizerTests *this)

{
  uint uVar1;
  short *psVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  int cx2;
  int cy2;
  int iVar8;
  int iVar9;
  cell *pcVar10;
  cell *pcVar11;
  int cx1;
  count_t cVar12;
  int iVar13;
  uchar *puVar14;
  uchar *puVar15;
  int cy2_1;
  int iVar16;
  long lVar17;
  int iVar18;
  cell *pcVar19;
  uint uVar20;
  allocator local_3c9;
  LocationInfo local_3c8;
  uint8_t reference2 [63];
  renderer r;
  uint8_t reference1 [9];
  string local_338;
  bitmap<unsigned_char,_0UL,_0UL> b4;
  bitmap<unsigned_char,_0UL,_0UL> b3;
  bitmap<unsigned_char,_0UL,_0UL> b2;
  bitmap<unsigned_char,_0UL,_0UL> b1;
  uint8_t reference4 [30];
  undefined1 local_270 [116];
  undefined8 local_1fc;
  undefined8 uStack_1f4;
  undefined1 local_1e0 [116];
  undefined8 local_16c;
  undefined8 uStack_164;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
  local_150;
  undefined1 local_c0 [120];
  int iStack_48;
  undefined8 uStack_44;
  
  mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap(&b1,3,3);
  mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap(&b2,7,9);
  mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap(&b3,3,3);
  mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap(&b4,5,6);
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_c0);
  vector_rasterizer::vector_rasterizer(&local_150.super_vector_rasterizer);
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_1e0);
  vector_rasterizer::vector_rasterizer((vector_rasterizer *)local_270);
  r._scanline_cache._buffer = (uint8_t *)0x0;
  r._scanline_cache._size = 0;
  stack0xffffffffffffffb4 = 0xa400000080;
  uStack_44 = 0x2c000000238;
  local_150.super_vector_rasterizer._116_4_ = 0x80;
  local_150._120_4_ = 0xa4;
  local_150._124_8_ = 0x2c000000238;
  local_16c._0_4_ = 0.5;
  local_16c._4_4_ = 0.640625;
  uStack_164 = 0x40300000400e0000;
  local_1fc._0_4_ = 0.5;
  local_1fc._4_4_ = 0.640625;
  uStack_1f4 = 0x40300000400e0000;
  vector_rasterizer::line((vector_rasterizer *)local_c0,0x80,0xa4,0x80,0x2c0);
  vector_rasterizer::line
            ((vector_rasterizer *)local_c0,local_c0._116_4_,uStack_44._4_4_,(int)uStack_44,
             uStack_44._4_4_);
  vector_rasterizer::line
            ((vector_rasterizer *)local_c0,(int)uStack_44,uStack_44._4_4_,(int)uStack_44,iStack_48);
  vector_rasterizer::line
            ((vector_rasterizer *)local_c0,(int)uStack_44,iStack_48,local_c0._116_4_,iStack_48);
  vector_rasterizer::sort((vector_rasterizer *)local_c0,false);
  reference2._0_8_ = &local_3c8;
  local_3c8.filename.field_2._M_allocated_capacity = 0;
  local_3c8.filename._M_dataplus._M_p = (pointer)0x0;
  local_3c8.filename._M_string_length = 0;
  reference2[8] = '\0';
  reference2[9] = '\0';
  reference2[10] = '\0';
  reference2[0xb] = '\0';
  reference2[0xc] = '\0';
  reference2[0xd] = '\0';
  reference2[0xe] = '\0';
  reference2[0xf] = '\0';
  reference2[0x10] = '\0';
  reference2[0x11] = '\0';
  reference2[0x12] = '\0';
  reference2[0x13] = '\0';
  reference2[0x14] = '\0';
  reference2[0x15] = '\0';
  reference2[0x16] = '\0';
  reference2[0x17] = '\0';
  reference2._24_8_ = b1._24_8_;
  cVar12 = (local_c0._104_4_ - local_c0._100_4_) + 5;
  reference2._40_7_ = SUB87(&b1,0);
  reference2[0x2f] = (uint8_t)((ulong)&b1 >> 0x38);
  if ((int)local_c0._108_4_ < (int)local_c0._96_4_) {
    cVar12 = 4;
  }
  puVar7 = raw_memory_object::get<unsigned_char>(&r._scanline_cache,cVar12);
  lVar17 = (long)(int)local_c0._96_4_;
  iVar5 = (local_c0._108_4_ - local_c0._96_4_) + 1;
  if ((int)local_c0._108_4_ < (int)local_c0._96_4_) {
    iVar5 = 0;
  }
  iVar5 = iVar5 + local_c0._96_4_;
  do {
    uVar3 = local_c0._0_8_;
    if (iVar5 <= lVar17) {
      std::
      _Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
      ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                       *)&local_3c8);
      rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
      ::line(&local_150,local_150.super_vector_rasterizer._116_4_,local_150._120_4_,
             local_150.super_vector_rasterizer._116_4_,local_150._128_4_);
      rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
      ::line(&local_150,local_150.super_vector_rasterizer._116_4_,local_150._128_4_,
             local_150._124_4_,local_150._128_4_);
      rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
      ::line(&local_150,local_150._124_4_,local_150._128_4_,local_150._124_4_,local_150._120_4_);
      rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
      ::line(&local_150,local_150._124_4_,local_150._120_4_,
             local_150.super_vector_rasterizer._116_4_,local_150._120_4_);
      vector_rasterizer::sort(&local_150.super_vector_rasterizer,false);
      local_3c8.filename.field_2._M_allocated_capacity = 0;
      local_3c8.filename._M_dataplus._M_p = (pointer)0x0;
      local_3c8.filename._M_string_length = 0;
      reference2[8] = '\0';
      reference2[9] = '\0';
      reference2[10] = '\0';
      reference2[0xb] = '\0';
      reference2[0xc] = '\0';
      reference2[0xd] = '\0';
      reference2[0xe] = '\0';
      reference2[0xf] = '\0';
      reference2[0x10] = '\0';
      reference2[0x11] = '\0';
      reference2[0x12] = '\0';
      reference2[0x13] = '\0';
      reference2[0x14] = '\0';
      reference2[0x15] = '\0';
      reference2[0x16] = '\0';
      reference2[0x17] = '\0';
      reference2._24_8_ = b2._24_8_;
      reference2._40_7_ = SUB87(&b2,0);
      reference2[0x2f] = (uint8_t)((ulong)&b2 >> 0x38);
      cVar12 = (local_150.super_vector_rasterizer._max_x - local_150.super_vector_rasterizer._min_x)
               + 5;
      if (local_150.super_vector_rasterizer._max_y < local_150.super_vector_rasterizer._min_y) {
        cVar12 = 4;
      }
      reference2._0_8_ = &local_3c8;
      puVar7 = raw_memory_object::get<unsigned_char>(&r._scanline_cache,cVar12);
      lVar17 = (long)local_150.super_vector_rasterizer._min_y;
      iVar5 = (local_150.super_vector_rasterizer._max_y - local_150.super_vector_rasterizer._min_y)
              + 1;
      if (local_150.super_vector_rasterizer._max_y < local_150.super_vector_rasterizer._min_y) {
        iVar5 = 0;
      }
      iVar5 = iVar5 + local_150.super_vector_rasterizer._min_y;
      do {
        pcVar11 = local_150.super_vector_rasterizer._cells._begin;
        if (iVar5 <= lVar17) {
          std::
          _Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
          ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                           *)&local_3c8);
          rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
          ::line((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
                  *)local_1e0,(coord_type)local_16c,local_16c._4_4_,(coord_type)local_16c,
                 uStack_164._4_4_);
          rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
          ::line((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
                  *)local_1e0,(coord_type)local_16c,uStack_164._4_4_,(coord_type)uStack_164,
                 uStack_164._4_4_);
          rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
          ::line((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
                  *)local_1e0,(coord_type)uStack_164,uStack_164._4_4_,(coord_type)uStack_164,
                 local_16c._4_4_);
          rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
          ::line((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
                  *)local_1e0,(coord_type)uStack_164,local_16c._4_4_,(coord_type)local_16c,
                 local_16c._4_4_);
          vector_rasterizer::sort((vector_rasterizer *)local_1e0,false);
          local_3c8.filename.field_2._M_allocated_capacity = 0;
          local_3c8.filename._M_dataplus._M_p = (pointer)0x0;
          local_3c8.filename._M_string_length = 0;
          reference2[8] = '\0';
          reference2[9] = '\0';
          reference2[10] = '\0';
          reference2[0xb] = '\0';
          reference2[0xc] = '\0';
          reference2[0xd] = '\0';
          reference2[0xe] = '\0';
          reference2[0xf] = '\0';
          reference2[0x10] = '\0';
          reference2[0x11] = '\0';
          reference2[0x12] = '\0';
          reference2[0x13] = '\0';
          reference2[0x14] = '\0';
          reference2[0x15] = '\0';
          reference2[0x16] = '\0';
          reference2[0x17] = '\0';
          reference2._24_8_ = b3._24_8_;
          reference2._40_7_ = SUB87(&b3,0);
          reference2[0x2f] = (uint8_t)((ulong)&b3 >> 0x38);
          cVar12 = (local_1e0._104_4_ - local_1e0._100_4_) + 5;
          if ((int)local_1e0._108_4_ < (int)local_1e0._96_4_) {
            cVar12 = 4;
          }
          reference2._0_8_ = &local_3c8;
          puVar7 = raw_memory_object::get<unsigned_char>(&r._scanline_cache,cVar12);
          lVar17 = (long)(int)local_1e0._96_4_;
          iVar5 = (local_1e0._108_4_ - local_1e0._96_4_) + 1;
          if ((int)local_1e0._108_4_ < (int)local_1e0._96_4_) {
            iVar5 = 0;
          }
          iVar5 = iVar5 + local_1e0._96_4_;
          do {
            uVar3 = local_1e0._0_8_;
            if (iVar5 <= lVar17) {
              std::
              _Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
              ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                               *)&local_3c8);
              rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
              ::line((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
                      *)local_270,(coord_type)local_1fc,local_1fc._4_4_,(coord_type)local_1fc,
                     uStack_1f4._4_4_);
              rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
              ::line((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
                      *)local_270,(coord_type)local_1fc,uStack_1f4._4_4_,(coord_type)uStack_1f4,
                     uStack_1f4._4_4_);
              rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
              ::line((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
                      *)local_270,(coord_type)uStack_1f4,uStack_1f4._4_4_,(coord_type)uStack_1f4,
                     local_1fc._4_4_);
              rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
              ::line((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
                      *)local_270,(coord_type)uStack_1f4,local_1fc._4_4_,(coord_type)local_1fc,
                     local_1fc._4_4_);
              vector_rasterizer::sort((vector_rasterizer *)local_270,false);
              local_3c8.filename.field_2._M_allocated_capacity = 0;
              local_3c8.filename._M_dataplus._M_p = (pointer)0x0;
              local_3c8.filename._M_string_length = 0;
              reference2[8] = '\0';
              reference2[9] = '\0';
              reference2[10] = '\0';
              reference2[0xb] = '\0';
              reference2[0xc] = '\0';
              reference2[0xd] = '\0';
              reference2[0xe] = '\0';
              reference2[0xf] = '\0';
              reference2[0x10] = '\0';
              reference2[0x11] = '\0';
              reference2[0x12] = '\0';
              reference2[0x13] = '\0';
              reference2[0x14] = '\0';
              reference2[0x15] = '\0';
              reference2[0x16] = '\0';
              reference2[0x17] = '\0';
              reference2._24_8_ = b4._24_8_;
              reference2._40_7_ = SUB87(&b4,0);
              reference2[0x2f] = (uint8_t)((ulong)&b4 >> 0x38);
              cVar12 = (local_270._104_4_ - local_270._100_4_) + 5;
              if ((int)local_270._108_4_ < (int)local_270._96_4_) {
                cVar12 = 4;
              }
              reference2._0_8_ = &local_3c8;
              puVar7 = raw_memory_object::get<unsigned_char>(&r._scanline_cache,cVar12);
              lVar17 = (long)(int)local_270._96_4_;
              iVar5 = (local_270._108_4_ - local_270._96_4_) + 1;
              if ((int)local_270._108_4_ < (int)local_270._96_4_) {
                iVar5 = 0;
              }
              iVar5 = iVar5 + local_270._96_4_;
              do {
                uVar3 = local_270._0_8_;
                if (iVar5 <= lVar17) {
                  std::
                  _Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                  ::~_Vector_base((_Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                                   *)&local_3c8);
                  reference1[0] = '.';
                  reference1[1] = '\\';
                  reference1[2] = '\x14';
                  reference1[3] = 0x80;
                  reference1[4] = 0xff;
                  reference1[5] = '8';
                  reference1[6] = '`';
                  reference1[7] = 0xc0;
                  reference1[8] = '*';
                  std::__cxx11::string::string
                            ((string *)&local_3c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
                             ,(allocator *)&local_338);
                  ut::LocationInfo::LocationInfo
                            ((LocationInfo *)reference2,&local_3c8.filename,0xfe);
                  ut::
                  are_equal<unsigned_char,9ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            (&reference1,&b1.data,(LocationInfo *)reference2);
                  std::__cxx11::string::_M_dispose();
                  std::__cxx11::string::_M_dispose();
                  std::__cxx11::string::string
                            ((string *)&local_3c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
                             ,(allocator *)&local_338);
                  ut::LocationInfo::LocationInfo
                            ((LocationInfo *)reference2,&local_3c8.filename,0xff);
                  ut::
                  are_equal<unsigned_char,9ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            (&reference1,&b3.data,(LocationInfo *)reference2);
                  std::__cxx11::string::_M_dispose();
                  std::__cxx11::string::_M_dispose();
                  reference2[0x30] = 0xa8;
                  reference2[0x31] = '\0';
                  reference2[0x32] = 0x80;
                  reference2[0x33] = 0xff;
                  reference2[0x34] = 0xff;
                  reference2[0x35] = 0xff;
                  reference2[0x36] = 0xff;
                  reference2[0x37] = 0xa8;
                  reference2[0x38] = '\0';
                  reference2[0x39] = ' ';
                  reference2[0x3a] = '@';
                  reference2[0x3b] = '@';
                  reference2[0x3c] = '@';
                  reference2[0x3d] = '@';
                  reference2[0x3e] = '*';
                  reference2[0x20] = 0xff;
                  reference2[0x21] = 0xff;
                  reference2[0x22] = 0xa8;
                  reference2[0x23] = '\0';
                  reference2[0x24] = 0x80;
                  reference2[0x25] = 0xff;
                  reference2[0x26] = 0xff;
                  reference2[0x27] = 0xff;
                  reference2[0x28] = 0xff;
                  reference2[0x29] = 0xa8;
                  reference2[0x2a] = '\0';
                  reference2[0x2b] = 0x80;
                  reference2[0x2c] = 0xff;
                  reference2[0x2d] = 0xff;
                  reference2[0x2e] = 0xff;
                  reference2[0x2f] = 0xff;
                  reference2[0x10] = 0xff;
                  reference2[0x11] = 0xff;
                  reference2[0x12] = 0xff;
                  reference2[0x13] = 0xff;
                  reference2[0x14] = 0xa8;
                  reference2[0x15] = '\0';
                  reference2[0x16] = 0x80;
                  reference2[0x17] = 0xff;
                  reference2[0x18] = 0xff;
                  reference2[0x19] = 0xff;
                  reference2[0x1a] = 0xff;
                  reference2[0x1b] = 0xa8;
                  reference2[0x1c] = '\0';
                  reference2[0x1d] = 0x80;
                  reference2[0x1e] = 0xff;
                  reference2[0x1f] = 0xff;
                  reference2[0] = '\0';
                  reference2[1] = '\0';
                  reference2[2] = '\0';
                  reference2[3] = '\0';
                  reference2[4] = '\0';
                  reference2[5] = '\0';
                  reference2[6] = '\0';
                  reference2[7] = '\0';
                  reference2[8] = '\n';
                  reference2[9] = '\x14';
                  reference2[10] = '\x14';
                  reference2[0xb] = '\x14';
                  reference2[0xc] = '\x14';
                  reference2[0xd] = '\r';
                  reference2[0xe] = '\0';
                  reference2[0xf] = 0x80;
                  std::__cxx11::string::string
                            ((string *)&local_338,
                             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
                             ,(allocator *)reference4);
                  ut::LocationInfo::LocationInfo(&local_3c8,&local_338,0x10d);
                  ut::
                  are_equal<unsigned_char,63ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            (&reference2,&b2.data,&local_3c8);
                  std::__cxx11::string::_M_dispose();
                  std::__cxx11::string::_M_dispose();
                  reference4[0x10] = 0xff;
                  reference4[0x11] = 0xff;
                  reference4[0x12] = 0xff;
                  reference4[0x13] = 'p';
                  reference4[0x14] = '\0';
                  reference4[0x15] = 0xff;
                  reference4[0x16] = 0xff;
                  reference4[0x17] = 0xff;
                  reference4[0x18] = 'p';
                  reference4[0x19] = '\0';
                  reference4[0x1a] = 0x80;
                  reference4[0x1b] = 0x80;
                  reference4[0x1c] = 0x80;
                  reference4[0x1d] = '8';
                  reference4[0] = '\0';
                  reference4[1] = '\0';
                  reference4[2] = '\0';
                  reference4[3] = '\0';
                  reference4[4] = '\0';
                  reference4[5] = '\0';
                  reference4[6] = 0xb8;
                  reference4[7] = 0xb8;
                  reference4[8] = 0xb8;
                  reference4[9] = 'P';
                  reference4[10] = '\0';
                  reference4[0xb] = 0xff;
                  reference4[0xc] = 0xff;
                  reference4[0xd] = 0xff;
                  reference4[0xe] = 'p';
                  reference4[0xf] = '\0';
                  std::__cxx11::string::string
                            ((string *)&local_338,
                             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
                             ,&local_3c9);
                  ut::LocationInfo::LocationInfo(&local_3c8,&local_338,0x118);
                  ut::
                  are_equal<unsigned_char,30ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                            (&reference4,&b4.data,&local_3c8);
                  std::__cxx11::string::_M_dispose();
                  std::__cxx11::string::_M_dispose();
                  raw_memory_object::~raw_memory_object(&r._scanline_cache);
                  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_270);
                  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_1e0);
                  vector_rasterizer::~vector_rasterizer(&local_150.super_vector_rasterizer);
                  vector_rasterizer::~vector_rasterizer((vector_rasterizer *)local_c0);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&b4);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&b3);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&b2);
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&b1);
                  return;
                }
                uVar20 = *(uint *)(local_270._24_8_ + (lVar17 - (int)local_270._96_4_) * 4);
                uVar1 = ((uint *)(local_270._24_8_ + (lVar17 - (int)local_270._96_4_) * 4))[1];
                bVar4 = renderer::
                        adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                        ::set_y((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                                 *)reference2,(int)lVar17);
                if (bVar4) {
                  iVar8 = 0;
                  iVar13 = 0;
                  if (uVar20 != uVar1) {
                    pcVar11 = (cell *)(uVar3 + (ulong)uVar20 * 10);
                    pcVar19 = (cell *)(uVar3 + (ulong)uVar1 * 10);
                    iVar8 = 0;
                    iVar13 = 0;
                    iVar18 = 0;
                    puVar14 = puVar7;
LAB_0017a7fb:
                    psVar2 = &pcVar11->x;
                    iVar9 = (int)*psVar2;
                    iVar6 = 0;
                    do {
                      pcVar10 = pcVar11 + 1;
                      iVar6 = iVar6 + pcVar11->area;
                      iVar18 = pcVar11->cover + iVar18;
                      pcVar11 = pcVar19;
                      if (pcVar10 == pcVar19) break;
                      pcVar11 = pcVar10;
                    } while (pcVar10->x == *psVar2);
                    iVar16 = iVar18 * 0x200;
                    if (iVar6 != 0) {
                      iVar6 = iVar16 - iVar6 >> 9;
                      if (0xfe < iVar6) {
                        iVar6 = 0xff;
                      }
                      if (iVar8 != iVar9) {
                        renderer::
                        adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                        ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                                      *)reference2,iVar13,iVar8 - iVar13,puVar7);
                        puVar14 = puVar7;
                        iVar8 = iVar9;
                        iVar13 = iVar9;
                      }
                      iVar8 = iVar8 + 1;
                      *puVar14 = (uchar)iVar6;
                      puVar14 = puVar14 + 1;
                      iVar9 = iVar9 + 1;
                    }
                    if (pcVar10 != pcVar19) {
                      uVar20 = pcVar11->x - iVar9;
                      if ((uVar20 != 0) && (iVar16 != 0)) {
                        iVar6 = iVar16 >> 9;
                        if (0xfe < iVar16 >> 9) {
                          iVar6 = 0xff;
                        }
                        puVar15 = puVar14;
                        if (iVar8 != iVar9) {
                          renderer::
                          adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                          ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                                        *)reference2,iVar13,iVar8 - iVar13,puVar7);
                          puVar15 = puVar7;
                          iVar8 = iVar9;
                          iVar13 = iVar9;
                        }
                        iVar8 = iVar8 + uVar20;
                        puVar14 = puVar15 + uVar20;
                        memset<unsigned_char>(puVar15,(uchar)iVar6,uVar20);
                      }
                      goto LAB_0017a7fb;
                    }
                  }
                  renderer::
                  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                                *)reference2,iVar13,iVar8 - iVar13,puVar7);
                }
                lVar17 = lVar17 + 1;
              } while( true );
            }
            uVar20 = *(uint *)(local_1e0._24_8_ + (lVar17 - (int)local_1e0._96_4_) * 4);
            uVar1 = ((uint *)(local_1e0._24_8_ + (lVar17 - (int)local_1e0._96_4_) * 4))[1];
            bVar4 = renderer::
                    adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                    ::set_y((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                             *)reference2,(int)lVar17);
            if (bVar4) {
              iVar8 = 0;
              iVar13 = 0;
              if (uVar20 != uVar1) {
                pcVar11 = (cell *)(uVar3 + (ulong)uVar20 * 10);
                pcVar19 = (cell *)(uVar3 + (ulong)uVar1 * 10);
                iVar8 = 0;
                iVar13 = 0;
                iVar18 = 0;
                puVar14 = puVar7;
LAB_0017a526:
                psVar2 = &pcVar11->x;
                iVar9 = (int)*psVar2;
                iVar6 = 0;
                do {
                  pcVar10 = pcVar11 + 1;
                  iVar6 = iVar6 + pcVar11->area;
                  iVar18 = pcVar11->cover + iVar18;
                  pcVar11 = pcVar19;
                  if (pcVar10 == pcVar19) break;
                  pcVar11 = pcVar10;
                } while (pcVar10->x == *psVar2);
                iVar16 = iVar18 * 0x200;
                if (iVar6 != 0) {
                  iVar6 = iVar16 - iVar6 >> 9;
                  if (0xfe < iVar6) {
                    iVar6 = 0xff;
                  }
                  if (iVar8 != iVar9) {
                    renderer::
                    adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                    ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                                  *)reference2,iVar13,iVar8 - iVar13,puVar7);
                    puVar14 = puVar7;
                    iVar8 = iVar9;
                    iVar13 = iVar9;
                  }
                  iVar8 = iVar8 + 1;
                  *puVar14 = (uchar)iVar6;
                  puVar14 = puVar14 + 1;
                  iVar9 = iVar9 + 1;
                }
                if (pcVar10 != pcVar19) {
                  uVar20 = pcVar11->x - iVar9;
                  if ((uVar20 != 0) && (iVar16 != 0)) {
                    iVar6 = iVar16 >> 9;
                    if (0xfe < iVar16 >> 9) {
                      iVar6 = 0xff;
                    }
                    puVar15 = puVar14;
                    if (iVar8 != iVar9) {
                      renderer::
                      adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                      ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                                    *)reference2,iVar13,iVar8 - iVar13,puVar7);
                      puVar15 = puVar7;
                      iVar8 = iVar9;
                      iVar13 = iVar9;
                    }
                    iVar8 = iVar8 + uVar20;
                    puVar14 = puVar15 + uVar20;
                    memset<unsigned_char>(puVar15,(uchar)iVar6,uVar20);
                  }
                  goto LAB_0017a526;
                }
              }
              renderer::
              adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
              ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                            *)reference2,iVar13,iVar8 - iVar13,puVar7);
            }
            lVar17 = lVar17 + 1;
          } while( true );
        }
        uVar20 = local_150.super_vector_rasterizer._histogram_y._begin
                 [lVar17 - local_150.super_vector_rasterizer._min_y];
        uVar1 = (local_150.super_vector_rasterizer._histogram_y._begin +
                (lVar17 - local_150.super_vector_rasterizer._min_y))[1];
        bVar4 = renderer::
                adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                ::set_y((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                         *)reference2,(int)lVar17);
        if (bVar4) {
          iVar8 = 0;
          iVar13 = 0;
          if (uVar20 != uVar1) {
            pcVar19 = pcVar11 + uVar20;
            pcVar11 = pcVar11 + uVar1;
            iVar8 = 0;
            iVar13 = 0;
            iVar18 = 0;
            puVar14 = puVar7;
LAB_0017a253:
            psVar2 = &pcVar19->x;
            iVar9 = (int)*psVar2;
            iVar6 = 0;
            do {
              pcVar10 = pcVar19 + 1;
              iVar6 = iVar6 + pcVar19->area;
              iVar18 = pcVar19->cover + iVar18;
              pcVar19 = pcVar11;
              if (pcVar10 == pcVar11) break;
              pcVar19 = pcVar10;
            } while (pcVar10->x == *psVar2);
            iVar16 = iVar18 * 0x200;
            if (iVar6 != 0) {
              iVar6 = iVar16 - iVar6 >> 9;
              if (0xfe < iVar6) {
                iVar6 = 0xff;
              }
              if (iVar8 != iVar9) {
                renderer::
                adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                              *)reference2,iVar13,iVar8 - iVar13,puVar7);
                puVar14 = puVar7;
                iVar8 = iVar9;
                iVar13 = iVar9;
              }
              iVar8 = iVar8 + 1;
              *puVar14 = (uchar)iVar6;
              puVar14 = puVar14 + 1;
              iVar9 = iVar9 + 1;
            }
            if (pcVar10 != pcVar11) {
              uVar20 = pcVar19->x - iVar9;
              if ((uVar20 != 0) && (iVar16 != 0)) {
                iVar6 = iVar16 >> 9;
                if (0xfe < iVar16 >> 9) {
                  iVar6 = 0xff;
                }
                puVar15 = puVar14;
                if (iVar8 != iVar9) {
                  renderer::
                  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                                *)reference2,iVar13,iVar8 - iVar13,puVar7);
                  puVar15 = puVar7;
                  iVar8 = iVar9;
                  iVar13 = iVar9;
                }
                iVar8 = iVar8 + uVar20;
                puVar14 = puVar15 + uVar20;
                memset<unsigned_char>(puVar15,(uchar)iVar6,uVar20);
              }
              goto LAB_0017a253;
            }
          }
          renderer::
          adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
          ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                        *)reference2,iVar13,iVar8 - iVar13,puVar7);
        }
        lVar17 = lVar17 + 1;
      } while( true );
    }
    uVar20 = *(uint *)(local_c0._24_8_ + (lVar17 - (int)local_c0._96_4_) * 4);
    uVar1 = ((uint *)(local_c0._24_8_ + (lVar17 - (int)local_c0._96_4_) * 4))[1];
    bVar4 = renderer::
            adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
            ::set_y((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                     *)reference2,(int)lVar17);
    if (bVar4) {
      iVar8 = 0;
      iVar13 = 0;
      if (uVar20 != uVar1) {
        pcVar11 = (cell *)(uVar3 + (ulong)uVar20 * 10);
        pcVar19 = (cell *)(uVar3 + (ulong)uVar1 * 10);
        iVar8 = 0;
        iVar13 = 0;
        iVar18 = 0;
        puVar14 = puVar7;
LAB_00179f97:
        psVar2 = &pcVar11->x;
        iVar9 = (int)*psVar2;
        iVar6 = 0;
        do {
          pcVar10 = pcVar11 + 1;
          iVar6 = iVar6 + pcVar11->area;
          iVar18 = pcVar11->cover + iVar18;
          pcVar11 = pcVar19;
          if (pcVar10 == pcVar19) break;
          pcVar11 = pcVar10;
        } while (pcVar10->x == *psVar2);
        iVar16 = iVar18 * 0x200;
        if (iVar6 != 0) {
          iVar6 = iVar16 - iVar6 >> 9;
          if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar8 != iVar9) {
            renderer::
            adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
            ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                          *)reference2,iVar13,iVar8 - iVar13,puVar7);
            puVar14 = puVar7;
            iVar8 = iVar9;
            iVar13 = iVar9;
          }
          iVar8 = iVar8 + 1;
          *puVar14 = (uchar)iVar6;
          puVar14 = puVar14 + 1;
          iVar9 = iVar9 + 1;
        }
        if (pcVar10 != pcVar19) {
          uVar20 = pcVar11->x - iVar9;
          if ((uVar20 != 0) && (iVar16 != 0)) {
            iVar6 = iVar16 >> 9;
            if (0xfe < iVar16 >> 9) {
              iVar6 = 0xff;
            }
            puVar15 = puVar14;
            if (iVar8 != iVar9) {
              renderer::
              adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
              ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                            *)reference2,iVar13,iVar8 - iVar13,puVar7);
              puVar15 = puVar7;
              iVar8 = iVar9;
              iVar13 = iVar9;
            }
            iVar8 = iVar8 + uVar20;
            puVar14 = puVar15 + uVar20;
            memset<unsigned_char>(puVar15,(uchar)iVar6,uVar20);
          }
          goto LAB_00179f97;
        }
      }
      renderer::
      adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
      ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                    *)reference2,iVar13,iVar8 - iVar13,puVar7);
    }
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

test( CoordinatesAreTranslatedAfterClipping )
			{
				// INIT
				mocks::bitmap<uint8_t> b1(3, 3), b2(7, 9), b3(3, 3), b4(5, 6);
				rasterizer< emitting_clipper<int>, scaling_i<1, 1> > r1;
				rasterizer< emitting_clipper<int>, scaling_i<1, 3> > r2;
				rasterizer< emitting_clipper<real_t>, scaling_r<1, 1> > r3;
				rasterizer< emitting_clipper<real_t>, scaling_r<1, 2> > r4;
				renderer r;

				r1.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 2.75f));
				r2.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 2.75f));
				r3.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 2.75f));
				r4.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 2.75f));

				// ACT
				r1.line_to(0.0f, 0.0f);
				r1.sort();
				r(b1, zero(), 0, r1, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				r2.line_to(0.0f, 0.0f);
				r2.sort();
				r(b2, zero(), 0, r2, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				r3.line_to(0.0f, 0.0f);
				r3.sort();
				r(b3, zero(), 0, r3, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				r4.line_to(0.0f, 0.0f);
				r4.sort();
				r(b4, zero(), 0, r4, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint8_t reference1[] = {
					0x2e, 0x5c, 0x14,
					0x80, 0xff, 0x38,
					0x60, 0xc0, 0x2a,
				};

				assert_equal(reference1, b1.data);
				assert_equal(reference1, b3.data);

				uint8_t reference2[] = {
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x0a, 0x14, 0x14, 0x14, 0x14, 0x0d,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x20, 0x40, 0x40, 0x40, 0x40, 0x2a,
				};

				assert_equal(reference2, b2.data);

				uint8_t reference4[] = {
					0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0xB8, 0xB8, 0xB8, 0x50,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0x80, 0x80, 0x80, 0x38,
				};

				assert_equal(reference4, b4.data);
			}